

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext *ctx,ExprVariableAccess *node)

{
  SynIdentifier *pSVar1;
  char *__src;
  int iVar2;
  LLVMValueRefOpaque **ppLVar3;
  undefined4 extraout_var;
  LLVMValueRef pLVar4;
  ulong uVar5;
  
  ppLVar3 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
            find(&ctx->variables,&node->variable->uniqueId);
  if (ppLVar3 != (LLVMValueRefOpaque **)0x0) {
    pSVar1 = node->variable->name;
    __src = (pSVar1->name).begin;
    uVar5 = (long)(pSVar1->name).end - (long)__src;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar5 + 1));
    uVar5 = uVar5 & 0xffffffff;
    memcpy((void *)CONCAT44(extraout_var,iVar2),__src,uVar5);
    *(undefined1 *)((long)CONCAT44(extraout_var,iVar2) + uVar5) = 0;
    pLVar4 = ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,node->variable->type);
    pLVar4 = CheckType(ctx,&node->super_ExprBase,pLVar4);
    return pLVar4;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x668,
                "LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext &, ExprVariableAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmVariableAccess(LlvmCompilationContext &ctx, ExprVariableAccess *node)
{
	LLVMValueRef *value = ctx.variables.find(node->variable->uniqueId);

	assert(value);

	return CheckType(ctx, node, ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, *value, CreateLlvmName(ctx, node->variable->name->name)), node->variable->type));
}